

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlWriter::XmlWriter(XmlWriter *this,ostream *os)

{
  this->m_tagIsOpen = false;
  this->m_needsNewline = false;
  (this->m_tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indent)._M_dataplus._M_p = (pointer)&(this->m_indent).field_2;
  (this->m_indent)._M_string_length = 0;
  (this->m_indent).field_2._M_local_buf[0] = '\0';
  this->m_os = os;
  writeDeclaration(this);
  return;
}

Assistant:

XmlWriter::XmlWriter(std::ostream &os)
      : m_os(os) {
    writeDeclaration();
  }